

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

void Geometry(int ip,int iq)

{
  pointer pBVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int (*paiVar5) [512];
  int b;
  ulong uVar6;
  uint uVar7;
  Clifford local_450;
  vector<Blade,_std::allocator<Blade>_> local_438;
  vector<Blade,_std::allocator<Blade>_> local_420;
  vector<Blade,_std::allocator<Blade>_> local_408;
  vector<Blade,_std::allocator<Blade>_> local_3f0;
  vector<Blade,_std::allocator<Blade>_> local_3d8;
  vector<Blade,_std::allocator<Blade>_> local_3c0;
  vector<Blade,_std::allocator<Blade>_> local_3a8;
  vector<Blade,_std::allocator<Blade>_> local_390;
  Clifford local_378;
  Clifford local_360;
  vector<Blade,_std::allocator<Blade>_> local_348;
  vector<Blade,_std::allocator<Blade>_> local_330;
  vector<Blade,_std::allocator<Blade>_> local_318;
  vector<Blade,_std::allocator<Blade>_> local_300;
  Clifford local_2e8;
  Clifford local_2d0;
  vector<Blade,_std::allocator<Blade>_> local_2b8;
  vector<Blade,_std::allocator<Blade>_> local_2a0;
  vector<Blade,_std::allocator<Blade>_> local_288;
  Clifford local_270;
  vector<Blade,_std::allocator<Blade>_> local_258;
  vector<Blade,_std::allocator<Blade>_> local_240;
  vector<Blade,_std::allocator<Blade>_> local_228;
  Clifford local_210;
  vector<Blade,_std::allocator<Blade>_> local_1f8;
  vector<Blade,_std::allocator<Blade>_> local_1e0;
  vector<Blade,_std::allocator<Blade>_> local_1c8;
  Clifford local_1b0;
  vector<Blade,_std::allocator<Blade>_> local_198;
  vector<Blade,_std::allocator<Blade>_> local_180;
  Clifford local_168;
  vector<Blade,_std::allocator<Blade>_> local_150;
  vector<Blade,_std::allocator<Blade>_> local_138;
  Clifford local_120;
  vector<Blade,_std::allocator<Blade>_> local_108;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  Clifford local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  
  uVar7 = 1 << ((byte)(iq + ip) & 0x1f);
  uVar4 = 0xffffffffffffffff;
  if (iq + ip != 0x1f) {
    uVar4 = (long)(int)uVar7 * 4;
  }
  tp = ip;
  tq = iq;
  dim = uVar7;
  Re = (float *)operator_new__(uVar4);
  uVar3 = 0;
  uVar4 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar4 = uVar3;
  }
  paiVar5 = signs;
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = sign2((int)uVar3,(int)uVar6);
      (*paiVar5)[uVar6] = iVar2;
    }
    paiVar5 = paiVar5 + 1;
  }
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e0);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e1);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e2);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e3);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e4);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e5);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e6);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e7);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e8);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e9);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Esd);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Eds);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eox);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eoy);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eoz);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ex);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ey);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&ez);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&eo);
  pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e0,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,1);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e1,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,2);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e2,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,4);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e3,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e4,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0x10);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e5,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e6.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0x20);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e6,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e7.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0x40);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e7,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0x80);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e8,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  pBVar1 = e9.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_450,0x100);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e9,(const_iterator)pBVar1,(Blade *)&local_450);
  Blade::~Blade((Blade *)&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e4);
  operator+(&local_450,&local_48,&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&ex,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,&e5);
  operator+(&local_450,&local_78,&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&ey,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,&e6);
  operator+(&local_450,&local_a8,&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&ez,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f0,&e7);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_108,&e4);
  operator-(&local_d8,&local_f0,&local_108);
  operator*(&local_450,0.5,&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&eox,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_138,&e8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_150,&e5);
  operator-(&local_120,&local_138,&local_150);
  operator*(&local_450,0.5,&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&eoy,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_150);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_138);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_180,&e9);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_198,&e6);
  operator-(&local_168,&local_180,&local_198);
  operator*(&local_450,0.5,&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&eoz,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_198);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1c8,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1e0,&ey);
  operator+(&local_1b0,&local_1c8,&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f8,&ez);
  operator+(&local_450,&local_1b0,&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&e,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_228,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_240,&eoy);
  operator+(&local_210,&local_228,&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_258,&eoz);
  operator+(&local_450,&local_210,&local_258);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&eo,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_258);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_228);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_288,&e1);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2a0,&e2);
  operator^(&local_270,&local_288,&local_2a0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_2b8,&e3);
  operator^(&local_450,&local_270,&local_2b8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&Ie,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_270);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_288);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_300,&ex);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_318,&ey);
  operator^(&local_2e8,&local_300,&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_330,&ez);
  operator^(&local_2d0,&local_2e8,&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_348,&eo);
  operator^(&local_450,&local_2d0,&local_348);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&Esd,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_348);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2d0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_330);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_2e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_318);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_300);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_390,&eox);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3a8,&eoy);
  operator^(&local_378,&local_390,&local_3a8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3c0,&eoz);
  operator^(&local_360,&local_378,&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3d8,&e);
  operator^(&local_450,&local_360,&local_3d8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&Eds,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_360);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_378);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_390);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_3f0,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_408,&Esd);
  operator^(&local_450,&local_3f0,&local_408);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&Isd,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_408);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_3f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_420,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_438,&Eds);
  operator^(&local_450,&local_420,&local_438);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&Ids,&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_450);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_438);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_420);
  return;
}

Assistant:

void Geometry(int ip,int iq)
{
//dimencion of algebra
	tp=ip; tq=iq;
	
	dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}

	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	e5.clear();
	e6.clear();
	e7.clear();
	e8.clear();
	e9.clear();

	Ie.clear();
	Esd.clear();
	Eds.clear();

	eox.clear();
	eoy.clear();
	eoz.clear();
	ex.clear();
	ey.clear();
	ez.clear();
	e.clear();
	eo.clear();

	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	e6.insert(e6.begin(),Blade(32));
	e7.insert(e7.begin(),Blade(64));
	e8.insert(e8.begin(),Blade(128));
	e9.insert(e9.begin(),Blade(256));

	
	ex=e7+e4;
    ey=e8+e5;
    ez=e9+e6;
	
    eox=0.5*(e7-e4);
    eoy=0.5*(e8-e5);
    eoz=0.5*(e9-e6);
	
    e=ex+ey+ez;
    eo=eox+eoy+eoz;
  
    Ie=e1^e2^e3;
    Esd=ex^ey^ez^eo;
    Eds=eox^eoy^eoz^e;
    Isd=Ie^Esd;
    Ids=Ie^Eds;

  return ;
	
}